

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mplayer.c
# Opt level: O2

void mplayer_talk(monst *mtmp)

{
  uint uVar1;
  char **ppcVar2;
  
  if ((mtmp->field_0x62 & 0x40) == 0) {
    ppcVar2 = mplayer_talk::other_class_msg;
    if (mtmp->data == mons + urole.femalenum) {
      ppcVar2 = mplayer_talk::same_class_msg;
    }
    if (mtmp->data == mons + urole.malenum) {
      ppcVar2 = mplayer_talk::same_class_msg;
    }
    uVar1 = mt_random();
    pline("Talk? -- %s",ppcVar2[(ulong)uVar1 % 3]);
    return;
  }
  return;
}

Assistant:

void mplayer_talk(struct monst *mtmp)
{
	static const char *const same_class_msg[3] = {
		"I can't win, and neither will you!",
		"You don't deserve to win!",
		"Mine should be the honor, not yours!",
	},		  *const other_class_msg[3] = {
		"The low-life wants to talk, eh?",
		"Fight, scum!",
		"Here is what I have to say!",
	};

	if (mtmp->mpeaceful) return; /* will drop to humanoid talk */

	pline("Talk? -- %s",
		(mtmp->data == &mons[urole.malenum] ||
		mtmp->data == &mons[urole.femalenum]) ?
		same_class_msg[rn2(3)] : other_class_msg[rn2(3)]);
}